

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

int __thiscall
Flasher::verify(Flasher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint8_t data;
  int iVar1;
  unique_ptr<Flash,_std::default_delete<Flash>_> *puVar2;
  _func_int *p_Var3;
  FlasherObserver *pFVar4;
  Samba *pSVar5;
  FileIoError *pFVar6;
  FileOpenError *pFVar7;
  undefined1 *__ptr;
  long lVar8;
  uint32_t size;
  size_t sVar9;
  uint16_t crc16;
  uint32_t *__filename;
  uint uVar10;
  pointer pFVar11;
  FlashOffsetError *pFVar12;
  FILE *pFVar13;
  int *piVar14;
  FileSizeError *pFVar15;
  long lVar16;
  ulong uVar17;
  uint32_t start_addr;
  ulong uVar18;
  undefined8 uStack_130;
  undefined1 auStack_128 [10];
  uint16_t local_11e;
  uint16_t local_11c;
  undefined1 local_119;
  size_t local_118;
  FileSizeError *local_110;
  uint local_108;
  uint local_104;
  FileIoError *local_100;
  FileIoError *local_f8;
  size_t local_f0;
  int local_e4;
  FileOpenError *local_e0;
  FileOpenError *local_d8;
  FlashOffsetError *local_d0;
  uint local_c4;
  Flasher *local_c0;
  undefined1 *local_b8;
  long local_b0;
  uint local_a0;
  uint local_9c;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  size_t local_88;
  size_t fbytes;
  long fsize;
  int local_70;
  uint16_t flashCrc;
  uint16_t calcCrc;
  uint32_t byteErrors;
  uint32_t pageOffset;
  uint32_t numPages;
  uint32_t pageNum;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_44;
  FILE *pFStack_40;
  uint32_t pageSize;
  FILE *infile;
  int *piStack_30;
  uint32_t foffset_local;
  uint32_t *totalErrors_local;
  uint32_t *pageErrors_local;
  char *filename_local;
  Flasher *this_local;
  
  infile._4_4_ = (uint)tbs;
  uStack_130 = 0x112173;
  local_c0 = this;
  piStack_30 = (int *)siglen;
  totalErrors_local = (uint32_t *)sig;
  pageErrors_local = (uint32_t *)ctx;
  filename_local = (char *)this;
  pFVar11 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uStack_130 = 0x11217f;
  local_44 = (*pFVar11->_vptr_Flash[3])();
  __vla_expr1 = (unsigned_long)local_44;
  local_b8 = auStack_128 + -(__vla_expr1 + 0xf & 0xfffffffffffffff0);
  _numPages = (ulong)local_44;
  lVar16 = (long)local_b8 - (_numPages + 0xf & 0xfffffffffffffff0);
  pageOffset = 0;
  local_70 = 0;
  fsize._6_2_ = 0;
  *totalErrors_local = 0;
  *piStack_30 = 0;
  local_b0 = lVar16;
  __vla_expr0 = (unsigned_long)auStack_128;
  if (infile._4_4_ % local_44 == 0) {
    local_c4 = infile._4_4_;
    puVar2 = local_c0->_flash;
    __vla_expr0 = (unsigned_long)auStack_128;
    *(undefined8 *)(lVar16 + -8) = 0x11221b;
    pFVar11 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar2);
    p_Var3 = pFVar11->_vptr_Flash[6];
    *(undefined8 *)(lVar16 + -8) = 0x112224;
    uVar10 = (*p_Var3)();
    __filename = pageErrors_local;
    if (local_c4 < uVar10) {
      _flashCrc = infile._4_4_ / local_44;
      *(undefined8 *)(lVar16 + -8) = 0x1122a6;
      pFVar13 = fopen((char *)__filename,"rb");
      pFStack_40 = pFVar13;
      if (pFVar13 == (FILE *)0x0) {
        *(undefined8 *)(lVar16 + -8) = 0x1122bb;
        local_e0 = (FileOpenError *)__cxa_allocate_exception(0x10);
        local_d8 = local_e0;
        *(undefined8 *)(lVar16 + -8) = 0x1122ce;
        piVar14 = __errno_location();
        pFVar7 = local_d8;
        iVar1 = *piVar14;
        *(undefined8 *)(lVar16 + -8) = 0x1122dc;
        FileOpenError::FileOpenError(pFVar7,iVar1);
        pFVar7 = local_e0;
        *(undefined1 **)(lVar16 + -8) = &LAB_001122f8;
        __cxa_throw(pFVar7,&FileOpenError::typeinfo,FileOpenError::~FileOpenError);
      }
      *(undefined8 *)(lVar16 + -8) = 0x11232d;
      local_e4 = fseek(pFVar13,0,2);
      pFVar13 = pFStack_40;
      if (local_e4 == 0) {
        *(undefined8 *)(lVar16 + -8) = 0x112349;
        local_f0 = ftell(pFVar13);
        pFVar13 = pFStack_40;
        fbytes = local_f0;
        if (-1 < (long)local_f0) {
          *(undefined8 *)(lVar16 + -8) = 0x1123f6;
          rewind(pFVar13);
          local_108 = (uint)((long)((fbytes - 1) + (ulong)local_44) / (long)(ulong)local_44);
          puVar2 = local_c0->_flash;
          byteErrors = local_108;
          *(undefined8 *)(lVar16 + -8) = 0x112428;
          pFVar11 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar2);
          p_Var3 = pFVar11->_vptr_Flash[4];
          *(undefined8 *)(lVar16 + -8) = 0x112434;
          local_104 = (*p_Var3)();
          sVar9 = fbytes;
          if (local_104 < local_108) {
            *(undefined8 *)(lVar16 + -8) = 0x112456;
            pFVar15 = (FileSizeError *)__cxa_allocate_exception(8);
            local_110 = pFVar15;
            *(undefined8 *)(lVar16 + -8) = 0x112468;
            FileSizeError::FileSizeError(pFVar15);
            pFVar15 = local_110;
            *(undefined1 **)(lVar16 + -8) = &LAB_00112484;
            __cxa_throw(pFVar15,&FileSizeError::typeinfo,FileSizeError::~FileSizeError);
          }
          pFVar4 = local_c0->_observer;
          p_Var3 = pFVar4->_vptr_FlasherObserver[2];
          *(undefined8 *)(lVar16 + -8) = 0x1124e9;
          (*p_Var3)(pFVar4,"Verify %ld bytes of flash\n",sVar9);
          while( true ) {
            pFVar13 = pFStack_40;
            __ptr = local_b8;
            uVar17 = (ulong)local_44;
            *(undefined8 *)(lVar16 + -8) = 0x112507;
            local_118 = fread(__ptr,1,uVar17,pFVar13);
            local_88 = local_118;
            if (local_118 == 0) break;
            local_70 = 0;
            fsize._6_2_ = 0;
            pFVar4 = local_c0->_observer;
            uVar18 = (ulong)pageOffset;
            uVar17 = (ulong)byteErrors;
            p_Var3 = pFVar4->_vptr_FlasherObserver[3];
            *(undefined8 *)(lVar16 + -8) = 0x11254c;
            (*p_Var3)(pFVar4,uVar18,uVar17);
            pSVar5 = local_c0->_samba;
            *(undefined8 *)(lVar16 + -8) = 0x11255e;
            local_119 = Samba::canChecksumBuffer(pSVar5);
            if ((bool)local_119) {
              for (i_2 = 0; crc16 = fsize._6_2_, i_2 < local_88; i_2 = i_2 + 1) {
                pSVar5 = local_c0->_samba;
                data = local_b8[i_2];
                *(undefined8 *)(lVar16 + -8) = 0x1125b0;
                local_11c = Samba::checksumCalc(pSVar5,data,crc16);
                fsize._6_2_ = local_11c;
              }
              pSVar5 = local_c0->_samba;
              start_addr = (_flashCrc + pageOffset) * local_44;
              size = (uint32_t)local_88;
              *(undefined8 *)(lVar16 + -8) = 0x1125f6;
              local_11e = Samba::checksumBuffer(pSVar5,start_addr,size);
              fsize._4_2_ = local_11e;
              if (local_11e != fsize._6_2_) {
                puVar2 = local_c0->_flash;
                *(undefined8 *)(lVar16 + -8) = 0x11262a;
                pFVar11 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar2);
                lVar8 = local_b0;
                uVar10 = _flashCrc + pageOffset;
                p_Var3 = pFVar11->_vptr_Flash[0x19];
                *(undefined8 *)(lVar16 + -8) = 0x112648;
                (*p_Var3)(pFVar11,(ulong)uVar10,lVar8);
                for (local_9c = 0; local_9c < local_88; local_9c = local_9c + 1) {
                  if (local_b8[local_9c] != *(char *)(local_b0 + (ulong)local_9c)) {
                    local_70 = local_70 + 1;
                  }
                }
              }
            }
            else {
              puVar2 = local_c0->_flash;
              *(undefined8 *)(lVar16 + -8) = 0x1126b9;
              pFVar11 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar2);
              lVar8 = local_b0;
              uVar10 = _flashCrc + pageOffset;
              p_Var3 = pFVar11->_vptr_Flash[0x19];
              *(undefined8 *)(lVar16 + -8) = 0x1126d7;
              (*p_Var3)(pFVar11,(ulong)uVar10,lVar8);
              for (local_a0 = 0; local_a0 < local_88; local_a0 = local_a0 + 1) {
                if (local_b8[local_a0] != *(char *)(local_b0 + (ulong)local_a0)) {
                  local_70 = local_70 + 1;
                }
              }
            }
            if (local_70 != 0) {
              *totalErrors_local = *totalErrors_local + 1;
              *piStack_30 = local_70 + *piStack_30;
            }
            pageOffset = pageOffset + 1;
            if ((pageOffset == byteErrors) || (local_88 != local_44)) break;
          }
          pFVar13 = pFStack_40;
          *(undefined8 *)(lVar16 + -8) = 0x112799;
          fclose(pFVar13);
          pFVar4 = local_c0->_observer;
          uVar18 = (ulong)byteErrors;
          uVar17 = (ulong)byteErrors;
          p_Var3 = pFVar4->_vptr_FlasherObserver[3];
          *(undefined8 *)(lVar16 + -8) = 0x1127b0;
          (*p_Var3)(pFVar4,uVar18,uVar17);
          return (int)CONCAT71((int7)(__vla_expr0 >> 8),*totalErrors_local == 0);
        }
      }
      *(undefined8 *)(lVar16 + -8) = 0x112371;
      local_100 = (FileIoError *)__cxa_allocate_exception(0x10);
      local_f8 = local_100;
      *(undefined8 *)(lVar16 + -8) = 0x112384;
      piVar14 = __errno_location();
      pFVar6 = local_f8;
      iVar1 = *piVar14;
      *(undefined8 *)(lVar16 + -8) = 0x112392;
      FileIoError::FileIoError(pFVar6,iVar1);
      pFVar6 = local_100;
      *(undefined1 **)(lVar16 + -8) = &LAB_001123ae;
      __cxa_throw(pFVar6,&FileIoError::typeinfo,FileIoError::~FileIoError);
    }
  }
  *(undefined8 *)(lVar16 + -8) = 0x11223a;
  pFVar12 = (FlashOffsetError *)__cxa_allocate_exception(8);
  local_d0 = pFVar12;
  *(undefined8 *)(lVar16 + -8) = 0x11224c;
  FlashOffsetError::FlashOffsetError(pFVar12);
  pFVar12 = local_d0;
  *(undefined1 **)(lVar16 + -8) = &LAB_00112268;
  __cxa_throw(pFVar12,&FlashOffsetError::typeinfo,FlashOffsetError::~FlashOffsetError);
}

Assistant:

bool
Flasher::verify(const char* filename, uint32_t& pageErrors, uint32_t& totalErrors, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t bufferA[pageSize];
    uint8_t bufferB[pageSize];
    uint32_t pageNum = 0;
    uint32_t numPages;
    uint32_t pageOffset;
    uint32_t byteErrors = 0;
    uint16_t calcCrc = 0;
    uint16_t flashCrc;
    long fsize;
    size_t fbytes;

    pageErrors = 0;
    totalErrors = 0;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    pageOffset = foffset / pageSize;
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Verify %ld bytes of flash\n", fsize);

        while ((fbytes = fread(bufferA, 1, pageSize, infile)) > 0)
        {
            byteErrors = 0;
            calcCrc = 0;
            _observer.onProgress(pageNum, numPages);

            if (_samba.canChecksumBuffer())
            {
                for (uint32_t i = 0; i < fbytes; i++)
                    calcCrc = _samba.checksumCalc(bufferA[i], calcCrc);
                
                

                flashCrc = _samba.checksumBuffer((pageOffset + pageNum) * pageSize, fbytes);
                
                if (flashCrc != calcCrc)
                {
                    _flash->readPage(pageOffset + pageNum, bufferB);

                    for (uint32_t i = 0; i < fbytes; i++)
                    {
                        if (bufferA[i] != bufferB[i])
                            byteErrors++;
                    }
                }
            }
            else
            {
                _flash->readPage(pageOffset + pageNum, bufferB);

                for (uint32_t i = 0; i < fbytes; i++)
                {
                    if (bufferA[i] != bufferB[i])
                        byteErrors++;
                }
            }
            
            if (byteErrors != 0)
            {
                pageErrors++;
                totalErrors += byteErrors;
            }

            pageNum++;
            if (pageNum == numPages || fbytes != pageSize)
                break;
        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);

     _observer.onProgress(numPages, numPages);
    
    if (pageErrors != 0)
        return false;

    return true;
}